

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_UnsupportedECHConfig_Test::TestBody
          (SSLTest_UnsupportedECHConfig_Test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_short> __l_00;
  initializer_list<unsigned_short> __l_01;
  bool bVar1;
  int iVar2;
  SSL_ECH_KEYS *__p;
  char *pcVar3;
  evp_hpke_key_st *peVar4;
  EVP_HPKE_KEM *kem;
  pointer psVar5;
  uchar *puVar6;
  size_type sVar7;
  char *in_R9;
  string local_700;
  AssertHelper local_6e0;
  Message local_6d8;
  bool local_6c9;
  undefined1 local_6c8 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_698;
  Message local_690;
  bool local_681;
  undefined1 local_680 [8];
  AssertionResult gtest_ar__10;
  ECHConfigParams invalid_public_name;
  AssertHelper local_5c8;
  Message local_5c0;
  bool local_5b1;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_580;
  Message local_578;
  bool local_569;
  undefined1 local_568 [8];
  AssertionResult gtest_ar__8;
  undefined1 local_540 [8];
  ECHConfigParams extensions;
  AssertHelper local_498;
  Message local_490;
  bool local_481;
  undefined1 local_480 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_450;
  Message local_448;
  bool local_439;
  undefined1 local_438 [8];
  AssertionResult gtest_ar__6;
  undefined1 local_410 [8];
  ECHConfigParams unsupported_aead;
  AssertHelper local_368;
  Message local_360;
  bool local_351;
  undefined1 local_350 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_320;
  Message local_318;
  bool local_309;
  undefined1 local_308 [8];
  AssertionResult gtest_ar__4;
  undefined1 local_2e0 [8];
  ECHConfigParams unsupported_kdf;
  AssertHelper local_238;
  Message local_230;
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1f0;
  Message local_1e8;
  bool local_1d9;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ech_config;
  ECHConfigParams unsupported_version;
  AssertHelper local_108;
  Message local_100;
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__1;
  ScopedEVP_HPKE_KEY key;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<SSL_ECH_KEYS> keys;
  SSLTest_UnsupportedECHConfig_Test *this_local;
  
  __p = SSL_ECH_KEYS_new();
  std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter> *)&gtest_ar_.message_,__p);
  testing::AssertionResult::
  AssertionResult<std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x4dabc5,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x81c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    internal::
    StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
    ::StackAllocatedMovable
              ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                *)&gtest_ar__1.message_);
    peVar4 = internal::
             StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
             ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                    *)&gtest_ar__1.message_);
    kem = EVP_hpke_x25519_hkdf_sha256();
    local_f4 = EVP_HPKE_KEY_generate(peVar4,kem);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_f0,&local_f4,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
    if (!bVar1) {
      testing::Message::Message(&local_100);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &unsupported_version.extensions.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(internal *)local_f0,
                 (AssertionResult *)
                 "EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x81e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_108,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      std::__cxx11::string::~string
                ((string *)
                 &unsupported_version.extensions.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_100);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
    if (bVar1) {
      ECHConfigParams::ECHConfigParams
                ((ECHConfigParams *)
                 &ech_config.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      ech_config.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_2_ = 0xffff;
      unsupported_version.public_name.field_2._8_8_ =
           internal::
           StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
           ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                  *)&gtest_ar__1.message_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__2.message_);
      local_1d9 = MakeECHConfig((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &gtest_ar__2.message_,
                                (ECHConfigParams *)
                                &ech_config.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1d8,&local_1d9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
      if (!bVar1) {
        testing::Message::Message(&local_1e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_1d8,
                   (AssertionResult *)"MakeECHConfig(&ech_config, unsupported_version)","false",
                   "true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x825,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
        testing::internal::AssertHelper::~AssertHelper(&local_1f0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_1e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
      if (bVar1) {
        psVar5 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                            &gtest_ar_.message_);
        puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &gtest_ar__2.message_);
        sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &gtest_ar__2.message_);
        peVar4 = internal::
                 StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                 ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                        *)&gtest_ar__1.message_);
        iVar2 = SSL_ECH_KEYS_add(psVar5,1,puVar6,sVar7,peVar4);
        local_221 = iVar2 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_220,&local_221,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
        if (!bVar1) {
          testing::Message::Message(&local_230);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)
                     &unsupported_kdf.extensions.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(internal *)local_220,
                     (AssertionResult *)
                     "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                     ,"true","false",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_238,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x828,pcVar3);
          testing::internal::AssertHelper::operator=(&local_238,&local_230);
          testing::internal::AssertHelper::~AssertHelper(&local_238);
          std::__cxx11::string::~string
                    ((string *)
                     &unsupported_kdf.extensions.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          testing::Message::~Message(&local_230);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
        ECHConfigParams::ECHConfigParams((ECHConfigParams *)local_2e0);
        unsupported_kdf.public_name.field_2._8_8_ =
             internal::
             StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
             ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                    *)&gtest_ar__1.message_);
        gtest_ar__4.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_2_ = 2;
        gtest_ar__4.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._6_2_ = 1;
        __l_01._M_len = 2;
        __l_01._M_array =
             (iterator)
             ((long)&gtest_ar__4.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                   &unsupported_kdf.max_name_len,__l_01);
        local_309 = MakeECHConfig((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &gtest_ar__2.message_,(ECHConfigParams *)local_2e0);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_308,&local_309,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
        if (!bVar1) {
          testing::Message::Message(&local_318);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__5.message_,(internal *)local_308,
                     (AssertionResult *)"MakeECHConfig(&ech_config, unsupported_kdf)","false","true"
                     ,in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_320,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x82f,pcVar3);
          testing::internal::AssertHelper::operator=(&local_320,&local_318);
          testing::internal::AssertHelper::~AssertHelper(&local_320);
          std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
          testing::Message::~Message(&local_318);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
        if (bVar1) {
          psVar5 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                              &gtest_ar_.message_);
          puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &gtest_ar__2.message_);
          sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &gtest_ar__2.message_);
          peVar4 = internal::
                   StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                   ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                          *)&gtest_ar__1.message_);
          iVar2 = SSL_ECH_KEYS_add(psVar5,1,puVar6,sVar7,peVar4);
          local_351 = iVar2 == 0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_350,&local_351,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
          if (!bVar1) {
            testing::Message::Message(&local_360);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)
                       &unsupported_aead.extensions.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(internal *)local_350,
                       (AssertionResult *)
                       "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                       ,"true","false",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_368,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x832,pcVar3);
            testing::internal::AssertHelper::operator=(&local_368,&local_360);
            testing::internal::AssertHelper::~AssertHelper(&local_368);
            std::__cxx11::string::~string
                      ((string *)
                       &unsupported_aead.extensions.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            testing::Message::~Message(&local_360);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
          ECHConfigParams::ECHConfigParams((ECHConfigParams *)local_410);
          unsupported_aead.public_name.field_2._8_8_ =
               internal::
               StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
               ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                      *)&gtest_ar__1.message_);
          gtest_ar__6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_2_ = 1;
          gtest_ar__6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._6_2_ = 0xffff;
          __l_00._M_len = 2;
          __l_00._M_array =
               (iterator)
               ((long)&gtest_ar__6.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 4);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     &unsupported_aead.max_name_len,__l_00);
          local_439 = MakeECHConfig((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    &gtest_ar__2.message_,(ECHConfigParams *)local_410);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_438,&local_439,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
          if (!bVar1) {
            testing::Message::Message(&local_448);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__7.message_,(internal *)local_438,
                       (AssertionResult *)"MakeECHConfig(&ech_config, unsupported_aead)","false",
                       "true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_450,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x836,pcVar3);
            testing::internal::AssertHelper::operator=(&local_450,&local_448);
            testing::internal::AssertHelper::~AssertHelper(&local_450);
            std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
            testing::Message::~Message(&local_448);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
          if (bVar1) {
            psVar5 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &gtest_ar__2.message_);
            sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &gtest_ar__2.message_);
            peVar4 = internal::
                     StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                     ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                            *)&gtest_ar__1.message_);
            iVar2 = SSL_ECH_KEYS_add(psVar5,1,puVar6,sVar7,peVar4);
            local_481 = iVar2 == 0;
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_480,&local_481,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
            if (!bVar1) {
              testing::Message::Message(&local_490);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)
                         &extensions.extensions.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(internal *)local_480,
                         (AssertionResult *)
                         "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                         ,"true","false",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_498,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x839,pcVar3);
              testing::internal::AssertHelper::operator=(&local_498,&local_490);
              testing::internal::AssertHelper::~AssertHelper(&local_498);
              std::__cxx11::string::~string
                        ((string *)
                         &extensions.extensions.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              testing::Message::~Message(&local_490);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
            ECHConfigParams::ECHConfigParams((ECHConfigParams *)local_540);
            extensions.public_name.field_2._8_8_ =
                 internal::
                 StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                 ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                        *)&gtest_ar__1.message_);
            gtest_ar__8.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = 0;
            gtest_ar__8.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_1_ = 1;
            gtest_ar__8.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._6_1_ = 0;
            gtest_ar__8.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._7_1_ = 0;
            __l._M_len = 4;
            __l._M_array = (iterator)
                           ((long)&gtest_ar__8.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           + 4);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &extensions.cipher_suites.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,__l);
            local_569 = MakeECHConfig((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &gtest_ar__2.message_,(ECHConfigParams *)local_540);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_568,&local_569,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
            if (!bVar1) {
              testing::Message::Message(&local_578);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__9.message_,(internal *)local_568,
                         (AssertionResult *)"MakeECHConfig(&ech_config, extensions)","false","true",
                         in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_580,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x840,pcVar3);
              testing::internal::AssertHelper::operator=(&local_580,&local_578);
              testing::internal::AssertHelper::~AssertHelper(&local_580);
              std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
              testing::Message::~Message(&local_578);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
            if (bVar1) {
              psVar5 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &gtest_ar__2.message_);
              sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &gtest_ar__2.message_);
              peVar4 = internal::
                       StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                       ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                              *)&gtest_ar__1.message_);
              iVar2 = SSL_ECH_KEYS_add(psVar5,1,puVar6,sVar7,peVar4);
              local_5b1 = iVar2 == 0;
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_5b0,&local_5b1,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
              if (!bVar1) {
                testing::Message::Message(&local_5c0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)
                           &invalid_public_name.extensions.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_5b0,
                           (AssertionResult *)
                           "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                           ,"true","false",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_5c8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x843,pcVar3);
                testing::internal::AssertHelper::operator=(&local_5c8,&local_5c0);
                testing::internal::AssertHelper::~AssertHelper(&local_5c8);
                std::__cxx11::string::~string
                          ((string *)
                           &invalid_public_name.extensions.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
                testing::Message::~Message(&local_5c0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
              ECHConfigParams::ECHConfigParams((ECHConfigParams *)&gtest_ar__10.message_);
              invalid_public_name.public_name.field_2._8_8_ =
                   internal::
                   StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                   ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                          *)&gtest_ar__1.message_);
              std::__cxx11::string::operator=
                        ((string *)&invalid_public_name,"dns_names_have_no_underscores.example");
              local_681 = MakeECHConfig((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        &gtest_ar__2.message_,
                                        (ECHConfigParams *)&gtest_ar__10.message_);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_680,&local_681,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
              if (!bVar1) {
                testing::Message::Message(&local_690);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__11.message_,(internal *)local_680,
                           (AssertionResult *)"MakeECHConfig(&ech_config, invalid_public_name)",
                           "false","true",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_698,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x849,pcVar3);
                testing::internal::AssertHelper::operator=(&local_698,&local_690);
                testing::internal::AssertHelper::~AssertHelper(&local_698);
                std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
                testing::Message::~Message(&local_690);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
              if (bVar1) {
                psVar5 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    &gtest_ar__2.message_);
                sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &gtest_ar__2.message_);
                peVar4 = internal::
                         StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                         ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                                *)&gtest_ar__1.message_);
                iVar2 = SSL_ECH_KEYS_add(psVar5,1,puVar6,sVar7,peVar4);
                local_6c9 = iVar2 == 0;
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_6c8,&local_6c9,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_6c8);
                if (!bVar1) {
                  testing::Message::Message(&local_6d8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_700,(internal *)local_6c8,
                             (AssertionResult *)
                             "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                             ,"true","false",in_R9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_6e0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x84c,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_6e0,&local_6d8);
                  testing::internal::AssertHelper::~AssertHelper(&local_6e0);
                  std::__cxx11::string::~string((string *)&local_700);
                  testing::Message::~Message(&local_6d8);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c8);
              }
              ECHConfigParams::~ECHConfigParams((ECHConfigParams *)&gtest_ar__10.message_);
            }
            ECHConfigParams::~ECHConfigParams((ECHConfigParams *)local_540);
          }
          ECHConfigParams::~ECHConfigParams((ECHConfigParams *)local_410);
        }
        ECHConfigParams::~ECHConfigParams((ECHConfigParams *)local_2e0);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__2.message_);
      ECHConfigParams::~ECHConfigParams
                ((ECHConfigParams *)
                 &ech_config.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    internal::
    StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
    ::~StackAllocatedMovable
              ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                *)&gtest_ar__1.message_);
  }
  std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SSLTest, UnsupportedECHConfig) {
  bssl::UniquePtr<SSL_ECH_KEYS> keys(SSL_ECH_KEYS_new());
  ASSERT_TRUE(keys);
  bssl::ScopedEVP_HPKE_KEY key;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));

  // Unsupported versions are rejected.
  ECHConfigParams unsupported_version;
  unsupported_version.version = 0xffff;
  unsupported_version.key = key.get();
  std::vector<uint8_t> ech_config;
  ASSERT_TRUE(MakeECHConfig(&ech_config, unsupported_version));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));

  // Unsupported cipher suites are rejected. (We only support HKDF-SHA256.)
  ECHConfigParams unsupported_kdf;
  unsupported_kdf.key = key.get();
  unsupported_kdf.cipher_suites = {0x002 /* HKDF-SHA384 */,
                                   EVP_HPKE_AES_128_GCM};
  ASSERT_TRUE(MakeECHConfig(&ech_config, unsupported_kdf));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));
  ECHConfigParams unsupported_aead;
  unsupported_aead.key = key.get();
  unsupported_aead.cipher_suites = {EVP_HPKE_HKDF_SHA256, 0xffff};
  ASSERT_TRUE(MakeECHConfig(&ech_config, unsupported_aead));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));


  // Unsupported extensions are rejected.
  ECHConfigParams extensions;
  extensions.key = key.get();
  extensions.extensions = {0x00, 0x01, 0x00, 0x00};
  ASSERT_TRUE(MakeECHConfig(&ech_config, extensions));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));

  // Invalid public names are rejected.
  ECHConfigParams invalid_public_name;
  invalid_public_name.key = key.get();
  invalid_public_name.public_name = "dns_names_have_no_underscores.example";
  ASSERT_TRUE(MakeECHConfig(&ech_config, invalid_public_name));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));
}